

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndIfCommand.cxx
# Opt level: O1

bool __thiscall
cmEndIfCommand::InitialPass
          (cmEndIfCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  char *__nptr;
  bool bVar2;
  double dVar3;
  string local_40;
  
  this_00 = (this->super_cmCommand).Makefile;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CMAKE_MINIMUM_REQUIRED_VERSION","");
  __nptr = cmMakefile::GetDefinition(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar2 = true;
  if (__nptr != (char *)0x0) {
    dVar3 = atof(__nptr);
    if (1.4 < dVar3) {
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "An ENDIF command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
                 ,"");
      cmCommand::SetError(&this->super_cmCommand,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmEndIfCommand::InitialPass(std::vector<std::string> const&,
                                 cmExecutionStatus &)
{
  const char* versionValue
    = this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
  if (!versionValue || (atof(versionValue) <= 1.4))
    {
    return true;
    }

  this->SetError("An ENDIF command was found outside of a proper "
                 "IF ENDIF structure. Or its arguments did not match "
                 "the opening IF command.");
  return false;
}